

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O1

void CB_ALGS::output_example(vw *all,cb *data,example *ec,label *ld)

{
  uint32_t uVar1;
  int iVar2;
  wclass *pwVar3;
  shared_data *this;
  int *piVar4;
  _func_void_int_string_v_array<char> *p_Var5;
  v_array<char> vVar6;
  char cVar7;
  byte bVar8;
  cb_class *pcVar9;
  ostream *poVar10;
  ulong uVar11;
  uint uVar12;
  int *piVar13;
  wclass *pwVar14;
  bool bVar15;
  float fVar16;
  stringstream outputStringStream;
  undefined4 in_stack_fffffffffffffe18;
  undefined1 *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  cVar7 = (*(code *)PTR_test_label_002dcb40)(ld);
  fVar16 = 0.0;
  if (cVar7 == '\0') {
    pcVar9 = (data->cbcs).known_cost;
    uVar1 = (ec->pred).multiclass;
    pwVar14 = (data->cbcs).pred_scores.costs._begin;
    pwVar3 = (data->cbcs).pred_scores.costs._end;
    bVar15 = pwVar14 == pwVar3;
    if (!bVar15) {
      bVar15 = false;
      do {
        if (pwVar14->class_index == uVar1) {
          fVar16 = 0.0;
          if (pcVar9->action == uVar1) {
            fVar16 = (pcVar9->cost - pwVar14->x) / pcVar9->probability;
          }
          fVar16 = pwVar14->x + fVar16;
        }
        if (pwVar14->class_index == uVar1) break;
        pwVar14 = pwVar14 + 1;
        bVar15 = pwVar14 == pwVar3;
      } while (!bVar15);
    }
    if ((bVar15) && (fVar16 = 0.0, pcVar9->action == uVar1)) {
      fVar16 = pcVar9->cost / pcVar9->probability;
    }
  }
  this = all->sd;
  bVar15 = ec->test_only;
  bVar8 = (*(code *)PTR_test_label_002dcb40)(ld);
  shared_data::update(this,bVar15,(bool)(bVar8 ^ 1),fVar16,1.0,ec->num_features);
  piVar13 = (all->final_prediction_sink)._begin;
  piVar4 = (all->final_prediction_sink)._end;
  if (piVar13 != piVar4) {
    do {
      (*all->print)(*piVar13,(float)(ec->pred).multiclass,0.0,ec->tag);
      piVar13 = piVar13 + 1;
    } while (piVar13 != piVar4);
  }
  if (0 < all->raw_prediction) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pcVar9 = (ld->costs)._begin;
    if ((ld->costs)._end != pcVar9) {
      uVar12 = 1;
      uVar11 = 0;
      do {
        fVar16 = pcVar9[uVar11].partial_prediction;
        if (uVar12 != 1) {
          in_stack_fffffffffffffe18 = CONCAT13(0x20,(int3)in_stack_fffffffffffffe18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,&stack0xfffffffffffffe1b,1);
        }
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        in_stack_fffffffffffffe18 = CONCAT13(0x3a,(int3)in_stack_fffffffffffffe18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffe1b,1);
        std::ostream::_M_insert<double>((double)fVar16);
        uVar11 = (ulong)uVar12;
        pcVar9 = (ld->costs)._begin;
        uVar12 = uVar12 + 1;
      } while (uVar11 < (ulong)((long)(ld->costs)._end - (long)pcVar9 >> 4));
    }
    p_Var5 = all->print_text;
    iVar2 = all->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar6._begin._4_4_ = fVar16;
    vVar6._begin._0_4_ = in_stack_fffffffffffffe18;
    vVar6._end = (char *)ec;
    vVar6.end_array = in_stack_fffffffffffffe28;
    vVar6.erase_count = in_stack_fffffffffffffe30;
    (*p_Var5)(iVar2,(string)ec->tag,vVar6);
    if (in_stack_fffffffffffffe28 != local_1c8) {
      operator_delete(in_stack_fffffffffffffe28);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  bVar15 = (bool)(*(code *)PTR_test_label_002dcb40)(ld);
  CB::print_update(all,bVar15,ec,(multi_ex *)0x0,false);
  return;
}

Assistant:

void output_example(vw& all, cb& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;
  if (!CB::cb_label.test_label(&ld))
    loss = get_unbiased_cost(c.known_cost, c.pred_scores, ec.pred.multiclass);

  all.sd->update(ec.test_only, !CB::cb_label.test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink) all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      cb_class cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.action << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, CB::cb_label.test_label(&ld), ec, nullptr, false);
}